

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O0

Vec_Int_t * Abc_NtkPrecomputeCellPairs(Mio_Cell2_t *pCells,int nCells)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  long lVar4;
  int local_10c;
  ulong local_108;
  int t;
  int nFanins;
  int iGate2;
  int iGate1;
  int Count;
  int p;
  int v;
  int n;
  int k;
  int i;
  int iBestDiff;
  int iBestPerm;
  int iBestCell;
  int *Perm2;
  int *Perm1;
  int Perm [7];
  int nPerms [7];
  int *pPerm [7];
  word iThis;
  word tCur;
  word iBestArea;
  Vec_Int_t *vInfo;
  int nCells_local;
  Mio_Cell2_t *pCells_local;
  
  p_00 = Vec_IntAlloc(1000);
  iGate2 = 0;
  nFanins = -1;
  t = -1;
  for (n = 1; n < 7; n = n + 1) {
    piVar3 = Extra_PermSchedule(n);
    *(int **)(nPerms + (long)n * 2 + 6) = piVar3;
  }
  for (n = 1; n < 7; n = n + 1) {
    iVar1 = Extra_Factorial(n);
    Perm[(long)n + 6] = iVar1;
  }
  n = 2;
  do {
    if (nCells <= n) {
      for (n = 1; n < 7; n = n + 1) {
        if (*(long *)(nPerms + (long)n * 2 + 6) != 0) {
          free(*(void **)(nPerms + (long)n * 2 + 6));
          (nPerms + (long)n * 2 + 6)[0] = 0;
          (nPerms + (long)n * 2 + 6)[1] = 0;
        }
      }
      if (iGate2 != 0) {
        printf("In this library, %d cell pairs have equal functions (for example, %s and %s).\n",
               (long)iGate2 / 2 & 0xffffffff,pCells[nFanins].pName,pCells[t].pName);
      }
      return p_00;
    }
    uVar2 = *(uint *)&pCells[n].field_0x10 >> 0x1c;
    for (p = 0; p <= (int)uVar2; p = p + 1) {
      if (p == uVar2) {
        local_108 = pCells[n].uTruth ^ 0xffffffffffffffff;
      }
      else {
        local_108 = Abc_Tt6Flip(pCells[n].uTruth,p);
      }
      tCur = 0xffffffffffffffff;
      k = -1;
      i = -1;
      iBestDiff = -1;
      for (v = 2; v < nCells; v = v + 1) {
        if (uVar2 == *(uint *)&pCells[v].field_0x10 >> 0x1c) {
          if ((n == v) || (pCells[n].uTruth != pCells[v].uTruth)) {
            for (Count = 0; Count < (int)uVar2; Count = Count + 1) {
              Perm[(long)Count + -2] = Count;
            }
            iThis = pCells[v].uTruth;
            for (iGate1 = 0; iGate1 < Perm[(long)(int)uVar2 + 6]; iGate1 = iGate1 + 1) {
              if ((local_108 == iThis) && (pCells[v].AreaW < tCur)) {
                tCur = pCells[v].AreaW;
                iBestDiff = v;
                i = 0;
                for (Count = 0; Count < (int)uVar2; Count = Count + 1) {
                  i = Count << ((byte)(Perm[(long)Count + -2] << 2) & 0x1f) | i;
                }
                if (pCells[n].AreaW < pCells[v].AreaW) {
                  local_10c = -((int)pCells[v].AreaW - (int)pCells[n].AreaW);
                }
                else {
                  local_10c = (int)pCells[n].AreaW - (int)pCells[v].AreaW;
                }
                k = local_10c;
              }
              if (Perm[(long)(int)uVar2 + 6] != 1) {
                iThis = Abc_Tt6SwapAdjacent(iThis,*(int *)(*(long *)(nPerms + (long)(int)uVar2 * 2 +
                                                                              6) + (long)iGate1 * 4)
                                           );
                lVar4 = (long)*(int *)(*(long *)(nPerms + (long)(int)uVar2 * 2 + 6) +
                                      (long)iGate1 * 4);
                iVar1 = Perm[lVar4 + -2];
                Perm[lVar4 + -2] = Perm[lVar4 + -1];
                Perm[lVar4 + -1] = iVar1;
              }
            }
            if (iThis != pCells[v].uTruth) {
              __assert_fail("tCur == pCells[k].uTruth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                            ,0x6f,"Vec_Int_t *Abc_NtkPrecomputeCellPairs(Mio_Cell2_t *, int)");
            }
          }
          else {
            nFanins = n;
            t = v;
            iGate2 = iGate2 + 1;
          }
        }
      }
      Vec_IntPushThree(p_00,iBestDiff,i,k);
    }
    n = n + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Precompute cell parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Abc_NtkPrecomputeCellPairs( Mio_Cell2_t * pCells, int nCells )
{
    Vec_Int_t * vInfo = Vec_IntAlloc( 1000 );
    word iBestArea, tCur, iThis;
    int * pPerm[7], nPerms[7], Perm[7], * Perm1, * Perm2;
    int iBestCell, iBestPerm, iBestDiff;
    int i, k, n, v, p, Count = 0;
    int iGate1 = -1, iGate2 = -1;

    for ( i = 1; i <= 6; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 1; i <= 6; i++ )
        nPerms[i] = Extra_Factorial( i );

    for ( i = 2; i < nCells; i++ )
    {
        int nFanins = pCells[i].nFanins;
        for ( n = 0; n <= nFanins; n++ )
        {
            // get the truth table
            iThis = (n == nFanins) ? ~pCells[i].uTruth : Abc_Tt6Flip(pCells[i].uTruth, n);
            // init the comparison
            iBestArea = ~((word)0);
            iBestCell = iBestPerm = iBestDiff = -1;
            // iterate through cells
            for ( k = 2; k < nCells; k++ )
            {
                if ( nFanins != (int)pCells[k].nFanins )
                    continue;
                if ( i != k && pCells[i].uTruth == pCells[k].uTruth )
                {
                    iGate1 = i;
                    iGate2 = k;
                    Count++;
                    continue;
                }
                // set unit permutation
                for ( v = 0; v < nFanins; v++ )
                    Perm[v] = v;
                // go through all permutation of Cell[k]
                tCur = pCells[k].uTruth;
                for ( p = 0; p < nPerms[nFanins]; p++ )
                {
                    if ( iThis == tCur && iBestArea > pCells[k].AreaW ) 
                    {
                        iBestArea = pCells[k].AreaW;
                        iBestCell = k;
                        iBestPerm = 0;
                        for ( v = 0; v < nFanins; v++ )
                            iBestPerm |= (v << (Perm[v] << 2));
                        iBestDiff = (pCells[i].AreaW >= pCells[k].AreaW) ? (int)(pCells[i].AreaW - pCells[k].AreaW) : -(int)(pCells[k].AreaW - pCells[i].AreaW);
                    }
                    if ( nPerms[nFanins] == 1 )
                        continue;
                    // update
                    tCur  = Abc_Tt6SwapAdjacent( tCur, pPerm[nFanins][p] );
                    Perm1 = Perm + pPerm[nFanins][p];
                    Perm2 = Perm1 + 1;
                    ABC_SWAP( int, *Perm1, *Perm2 );
                }
                assert( tCur == pCells[k].uTruth );
            }
            Vec_IntPushThree( vInfo, iBestCell, iBestPerm, iBestDiff );
        }
    }

    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pPerm[i] );
    if ( Count )
        printf( "In this library, %d cell pairs have equal functions (for example, %s and %s).\n", Count/2, pCells[iGate1].pName, pCells[iGate2].pName );
    return vInfo;
}